

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mathCoreConstruct.cpp
# Opt level: O0

expression * mathCore::variable(string *identifier)

{
  mapped_type mVar1;
  bool bVar2;
  expression *this;
  pointer ppVar3;
  mapped_type *this_00;
  mapped_type *pmVar4;
  key_type local_3c;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_true>
  local_38;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_true>
  local_30;
  iterator iter;
  expression *exp;
  string *identifier_local;
  
  this = (expression *)operator_new(0x38);
  expression::expression(this);
  this->FLAGS = 2;
  local_30._M_cur =
       (__node_type *)
       std::
       unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
       ::find(&expression::string_to_uuid_abi_cxx11_,identifier);
  local_38._M_cur =
       (__node_type *)
       std::
       unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
       ::end(&expression::string_to_uuid_abi_cxx11_);
  bVar2 = std::__detail::operator!=(&local_30,&local_38);
  if (bVar2) {
    ppVar3 = std::__detail::
             _Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_false,_true>
             ::operator->((_Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_false,_true>
                           *)&local_30);
    this->uuid = ppVar3->second;
  }
  else {
    this->uuid = expression::global_uuid;
    local_3c = this->uuid;
    this_00 = std::
              unordered_map<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator[](&expression::uuid_to_string_abi_cxx11_,&local_3c);
    std::__cxx11::string::operator=((string *)this_00,(string *)identifier);
    mVar1 = this->uuid;
    pmVar4 = std::
             unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
             ::operator[](&expression::string_to_uuid_abi_cxx11_,identifier);
    *pmVar4 = mVar1;
    expression::global_uuid = expression::global_uuid + 1;
  }
  return this;
}

Assistant:

expression* mathCore::variable(const std::string& identifier) {
	expression* exp = new expression;
	exp->FLAGS = F_VAR;

	auto iter = expression::string_to_uuid.find(identifier);

	if (iter != expression::string_to_uuid.end()) {
		// Already is an existant identifier
		exp->uuid = iter->second;
	}
	else {
		// This is a new identifier
		exp->uuid = expression::global_uuid;

		// Make sure to save it in the map
		expression::uuid_to_string[exp->uuid] = identifier;
		expression::string_to_uuid[identifier] = exp->uuid;
		
		// Next literal gets the next uuid up
		expression::global_uuid++;
	}
	return exp;
}